

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

int memcmp(void *__s1,void *__s2,size_t __n)

{
  int iVar1;
  ulong uStack_40;
  int res;
  size_t i;
  uchar *rhs_;
  uchar *lhs_;
  size_t count_local;
  void *rhs_local;
  void *lhs_local;
  
  uStack_40 = 0;
  while( true ) {
    if (__n <= uStack_40) {
      return 0;
    }
    iVar1 = (uint)*(byte *)((long)__s1 + uStack_40) - (uint)*(byte *)((long)__s2 + uStack_40);
    if (iVar1 != 0) break;
    uStack_40 = uStack_40 + 1;
  }
  return iVar1;
}

Assistant:

int memcmp(const void *lhs, const void *rhs, size_t count) {
    const unsigned char *lhs_ = lhs;
    const unsigned char *rhs_ = rhs;

    for (size_t i = 0; i < count; ++i) {
        const int res = lhs_[i] - rhs_[i];
        if (res != 0) {
            return res;
        }
    }

    return 0;
}